

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

String * doctest::toString(String *__return_storage_ptr__,float in)

{
  long lVar1;
  string d;
  String local_1c0;
  string local_1a8 [32];
  ostringstream oss;
  undefined8 local_180 [2];
  uint auStack_170 [88];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  *(undefined8 *)((long)local_180 + *(long *)(_oss + -0x18)) = 5;
  *(uint *)((long)auStack_170 + *(long *)(_oss + -0x18)) =
       *(uint *)((long)auStack_170 + *(long *)(_oss + -0x18)) & 0xfffffefb | 4;
  std::ostream::operator<<((ostringstream *)&oss,in);
  std::__cxx11::stringbuf::str();
  lVar1 = std::__cxx11::string::find_last_not_of((char)&d,0x30);
  if ((lVar1 != -1) && (lVar1 != d._M_string_length - 1)) {
    std::__cxx11::string::substr((ulong)local_1a8,(ulong)&d);
    std::__cxx11::string::operator=((string *)&d,local_1a8);
    std::__cxx11::string::~string(local_1a8);
  }
  String::String(&local_1c0,d._M_dataplus._M_p);
  std::__cxx11::string::~string((string *)&d);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
  String::String((String *)&oss,"f");
  String::operator+(__return_storage_ptr__,&local_1c0,(String *)&oss);
  String::~String((String *)&oss);
  String::~String(&local_1c0);
  return __return_storage_ptr__;
}

Assistant:

String toString(float in) { return fpToString(in, 5) + "f"; }